

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::SyntaxRewriter<TestRewriter>::SyntaxRewriter(SyntaxRewriter<TestRewriter> *this)

{
  BumpAllocator *in_RDI;
  ChangeCollection *in_stack_00000010;
  BumpAllocator *alloc;
  
  alloc = in_RDI;
  BumpAllocator::BumpAllocator(in_RDI);
  SyntaxFactory::SyntaxFactory((SyntaxFactory *)(alloc + 1),alloc);
  in_RDI[1].endPtr = (byte *)0x0;
  detail::ChangeCollection::ChangeCollection(in_stack_00000010);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::vector((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
            *)0x7af1e9);
  return;
}

Assistant:

SyntaxRewriter() : factory(alloc) {}